

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCube.c
# Opt level: O1

void Mvc_CubeBitRemoveDcs(Mvc_Cube_t *pCube)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(*(uint *)&pCube->field_0x8 & 0xffffff);
  do {
    uVar1 = pCube->pData[uVar3];
    pCube->pData[uVar3] = ((uVar1 >> 1 ^ uVar1) & 0x55555555) * 3 & uVar1;
    bVar2 = 0 < (long)uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar2);
  return;
}

Assistant:

void Mvc_CubeBitRemoveDcs( Mvc_Cube_t * pCube )
{
    unsigned Mask;
    int i;
    for ( i = Mvc_CubeReadLast(pCube); i >= 0; i-- )
    {
        // detect those variables that are different (not DCs)
        Mask = (pCube->pData[i] ^ (pCube->pData[i] >> 1)) & BITS_DISJOINT; 
        // create the mask of all that are different
        Mask |= (Mask << 1);
        // remove other bits from the set
        pCube->pData[i] &= Mask;
    }
}